

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O2

nh_bool find_race(nh_roles_info *ri,char *race_str,int *out_race)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ri->num_races;
  if (ri->num_races < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return '\0';
    }
    iVar1 = strcmp(race_str,ri->racenames[uVar2]);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  *out_race = (int)uVar2;
  return '\x01';
}

Assistant:

static nh_bool find_race(const struct nh_roles_info *ri,
			 const char *race_str, int *out_race)
{
    int i;

    for (i = 0; i < ri->num_races; i++) {
	if (!strcmp(race_str, ri->racenames[i])) {
	    *out_race = i;
	    return TRUE;
	}
    }
    return FALSE;
}